

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int sasl_init_set_hostname(SASL_INIT_HANDLE sasl_init,char *hostname_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE hostname_amqp_value;
  SASL_INIT_INSTANCE *sasl_init_instance;
  int result;
  char *hostname_value_local;
  SASL_INIT_HANDLE sasl_init_local;
  
  if (sasl_init == (SASL_INIT_HANDLE)0x0) {
    sasl_init_instance._4_4_ = 0x2ab7;
  }
  else {
    item_value = amqpvalue_create_string(hostname_value);
    if (item_value == (AMQP_VALUE)0x0) {
      sasl_init_instance._4_4_ = 0x2abf;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(sasl_init->composite_value,2,item_value);
      if (iVar1 == 0) {
        sasl_init_instance._4_4_ = 0;
      }
      else {
        sasl_init_instance._4_4_ = 0x2ac5;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return sasl_init_instance._4_4_;
}

Assistant:

int sasl_init_set_hostname(SASL_INIT_HANDLE sasl_init, const char* hostname_value)
{
    int result;

    if (sasl_init == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)sasl_init;
        AMQP_VALUE hostname_amqp_value = amqpvalue_create_string(hostname_value);
        if (hostname_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(sasl_init_instance->composite_value, 2, hostname_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(hostname_amqp_value);
        }
    }

    return result;
}